

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Hop_Obj_t * Abc_ObjHopFromGia_rec(Hop_Man_t *pHopMan,Gia_Man_t *p,int Id,Vec_Ptr_t *vCopies)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  uint uVar3;
  Hop_Obj_t *pHVar4;
  Hop_Obj_t *pHVar5;
  
  if (p->nTravIdsAlloc <= Id) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
  }
  if (p->pTravIds[Id] == p->nTravIds) {
    if ((Id < 0) || (vCopies->nSize <= Id)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pHVar4 = (Hop_Obj_t *)vCopies->pArray[(uint)Id];
  }
  else {
    p->pTravIds[Id] = p->nTravIds;
    if ((Id < 0) || (p->nObjs <= Id)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar3 = (uint)*(undefined8 *)(p->pObjs + (uint)Id);
    if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                    ,0x2a9,
                    "Hop_Obj_t *Abc_ObjHopFromGia_rec(Hop_Man_t *, Gia_Man_t *, int, Vec_Ptr_t *)");
    }
    pGVar1 = p->pObjs + (uint)Id;
    pHVar4 = Abc_ObjHopFromGia_rec(pHopMan,p,Id - (uVar3 & 0x1fffffff),vCopies);
    pHVar5 = Abc_ObjHopFromGia_rec
                       (pHopMan,p,Id - (*(uint *)&pGVar1->field_0x4 & 0x1fffffff),vCopies);
    uVar2 = *(ulong *)pGVar1;
    pHVar4 = Hop_And(pHopMan,(Hop_Obj_t *)((ulong)((uint)(uVar2 >> 0x1d) & 1) ^ (ulong)pHVar4),
                     (Hop_Obj_t *)((ulong)((uint)(uVar2 >> 0x3d) & 1) ^ (ulong)pHVar5));
    if (vCopies->nSize <= Id) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    vCopies->pArray[(uint)Id] = pHVar4;
  }
  return pHVar4;
}

Assistant:

Hop_Obj_t * Abc_ObjHopFromGia_rec( Hop_Man_t * pHopMan, Gia_Man_t * p, int Id, Vec_Ptr_t * vCopies )
{
    Gia_Obj_t * pObj;
    Hop_Obj_t * gFunc, * gFunc0, * gFunc1;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return (Hop_Obj_t *)Vec_PtrEntry( vCopies, Id );
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj(p, Id);
    assert( Gia_ObjIsAnd(pObj) );
    // compute the functions of the children
    gFunc0 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId0(pObj, Id), vCopies );
    gFunc1 = Abc_ObjHopFromGia_rec( pHopMan, p, Gia_ObjFaninId1(pObj, Id), vCopies );
    // get the function of the cut
    gFunc  = Hop_And( pHopMan, Hop_NotCond(gFunc0, Gia_ObjFaninC0(pObj)), Hop_NotCond(gFunc1, Gia_ObjFaninC1(pObj)) );  
    Vec_PtrWriteEntry( vCopies, Id, gFunc );
    return gFunc;
}